

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParamsNode * __thiscall Parser::function_params(Parser *this)

{
  int iVar1;
  bool bVar2;
  Token *pTVar3;
  pointer pPVar4;
  pointer pPVar5;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  string local_58;
  unique_ptr<ParamNode,_std::default_delete<ParamNode>_> local_38;
  __single_object p;
  unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_> local_20;
  __single_object ps;
  Parser *this_local;
  
  ps._M_t.super___uniq_ptr_impl<ParamsNode,_std::default_delete<ParamsNode>_>._M_t.
  super__Tuple_impl<0UL,_ParamsNode_*,_std::default_delete<ParamsNode>_>.
  super__Head_base<0UL,_ParamsNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<ParamsNode,_std::default_delete<ParamsNode>,_true,_true>)
       (__uniq_ptr_data<ParamsNode,_std::default_delete<ParamsNode>,_true,_true>)this;
  std::make_unique<ParamsNode>();
  expect(this,'(');
  while( true ) {
    pTVar3 = next_token(this);
    if (pTVar3->kind == Eof) {
      this_local = (Parser *)0x0;
      p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
      super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
      super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl._0_4_ = 1;
      goto LAB_00126312;
    }
    bVar2 = is_punctuator(this,')');
    if (bVar2) break;
    bVar2 = is_builtin_type(this);
    if (bVar2) {
      std::make_unique<ParamNode>();
      iVar1 = this->tok->i;
      pPVar4 = std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::operator->(&local_38);
      *(int *)&(pPVar4->super_Node).field_0xc = iVar1;
      next_token(this);
      while (bVar2 = is_punctuator(this,'*'), bVar2) {
        next_token(this);
      }
      bVar2 = is(this,Identifier);
      if (bVar2) {
        LexData::id_text_abi_cxx11_(&local_58,this->lex_data,this->tok);
        pPVar4 = std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::operator->(&local_38);
        std::__cxx11::string::operator=((string *)&pPVar4->name,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        next_token(this);
        bVar2 = is_punctuator(this,')');
        if (!bVar2) {
          bVar2 = is_punctuator(this,',');
          if (!bVar2) {
            error<char_const(&)[38]>
                      (this,(char (*) [38])"expecting \',\' or \')\' after param name");
          }
          goto LAB_00126291;
        }
        pPVar5 = std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::operator->
                           (&local_20);
        local_60 = std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::get(&local_38);
        std::vector<ParamNode_*,_std::allocator<ParamNode_*>_>::push_back(&pPVar5->params,&local_60)
        ;
        std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::release(&local_38);
        this_local = (Parser *)
                     std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::release
                               (&local_20);
        p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
        super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
        super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar2 = is_punctuator(this,')');
        if (bVar2) {
          pPVar5 = std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::operator->
                             (&local_20);
          local_68 = std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::get(&local_38);
          std::vector<ParamNode_*,_std::allocator<ParamNode_*>_>::push_back
                    (&pPVar5->params,&local_68);
          std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::release(&local_38);
          this_local = (Parser *)
                       std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::release
                                 (&local_20);
          p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
          super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
          super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          bVar2 = is_punctuator(this,',');
          if (!bVar2) {
            error<char_const(&)[51]>
                      (this,(char (*) [51])"expecting \',\', \')\', or param name after param type")
            ;
          }
LAB_00126291:
          pPVar5 = std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::operator->
                             (&local_20);
          local_70 = std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::get(&local_38);
          std::vector<ParamNode_*,_std::allocator<ParamNode_*>_>::push_back
                    (&pPVar5->params,&local_70);
          std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::release(&local_38);
          p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
          super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
          super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl._0_4_ = 0;
        }
      }
      std::unique_ptr<ParamNode,_std::default_delete<ParamNode>_>::~unique_ptr(&local_38);
      if ((int)p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
               super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
               super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl != 0) {
LAB_00126312:
        std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::~unique_ptr(&local_20);
        return (ParamsNode *)this_local;
      }
    }
    else {
      error<char_const(&)[22]>(this,(char (*) [22])"expecting \')\' or type");
    }
  }
  this_local = (Parser *)
               std::unique_ptr<ParamsNode,_std::default_delete<ParamsNode>_>::release(&local_20);
  p._M_t.super___uniq_ptr_impl<ParamNode,_std::default_delete<ParamNode>_>._M_t.
  super__Tuple_impl<0UL,_ParamNode_*,_std::default_delete<ParamNode>_>.
  super__Head_base<0UL,_ParamNode_*,_false>._M_head_impl._0_4_ = 1;
  goto LAB_00126312;
}

Assistant:

ParamsNode* Parser::function_params()
{
  auto ps = std::make_unique<ParamsNode>();

  expect('(');
  while (next_token().kind != TokenKind::Eof) {
    if (is_punctuator(')')) {
      return ps.release();
    }
    else if (is_builtin_type()) {
      auto p = std::make_unique<ParamNode>();
      p->builtin_type = (Keyword)tok->i;

      next_token();

      // Pointers
      while (is_punctuator('*')) // TODO add this info to param type
        next_token();

      if (is(TokenKind::Identifier)) { // Param with name
        p->name = lex_data->id_text(*tok);

        next_token();
        if (is_punctuator(')')) {
          ps->params.push_back(p.get());
          p.release();
          return ps.release();
        }
        else if (!is_punctuator(','))
          error("expecting ',' or ')' after param name");
      }
      // Param without name
      else if (is_punctuator(')')) {
        ps->params.push_back(p.get());
        p.release();
        return ps.release();
      }
      else if (!is_punctuator(','))
        error("expecting ',', ')', or param name after param type");

      ps->params.push_back(p.get());
      p.release();
    }
    else {
      error("expecting ')' or type");
    }
  }

  return nullptr;
}